

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_normalize_var(secp256k1_fe *r)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *seckey;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*bin) [16];
  uint64_t uVar15;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  uint uVar16;
  undefined1 auVar17 [16];
  secp256k1_scalar asStack_100 [2];
  secp256k1_ge sStack_b0;
  secp256k1_fe *psStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  secp256k1_fe_verify(r);
  uVar8 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar10 = (uVar8 >> 0x34) + r->n[1];
  uVar8 = uVar8 & 0xfffffffffffff;
  uVar12 = (uVar10 >> 0x34) + r->n[2];
  uVar13 = (uVar12 >> 0x34) + r->n[3];
  uVar12 = uVar12 & 0xfffffffffffff;
  uVar15 = (uVar13 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar11 = uVar10 & 0xfffffffffffff;
  uVar14 = uVar13 & 0xfffffffffffff;
  if (0xffffefffffc2e < uVar8 &&
      ((uVar12 & uVar10 & uVar13) == 0xfffffffffffff && uVar15 == 0xffffffffffff) ||
      uVar15 >> 0x30 != 0) {
    uVar11 = uVar11 + (uVar8 + 0x1000003d1 >> 0x34);
    uVar12 = uVar12 + (uVar11 >> 0x34);
    bin = (undefined1 (*) [16])(uVar14 + (uVar12 >> 0x34));
    uVar10 = ((ulong)bin >> 0x34) + uVar15;
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(uVar10 & 0x3000000000000);
    if (ecmult_gen_ctx != (secp256k1_ecmult_gen_context *)0x1000000000000) {
      secp256k1_fe_normalize_var_cold_1();
      uStack_38 = 0xfffffffffffff;
      uStack_40 = 0xffffffffffff;
      psStack_48 = r;
      if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
        secp256k1_keypair_create_cold_4();
      }
      else if (bin != (undefined1 (*) [16])0x0) {
        bin[5] = (undefined1  [16])0x0;
        bin[4] = (undefined1  [16])0x0;
        bin[3] = (undefined1  [16])0x0;
        bin[2] = (undefined1  [16])0x0;
        bin[1] = (undefined1  [16])0x0;
        *bin = (undefined1  [16])0x0;
        if (ecmult_gen_ctx->built == 0) {
          secp256k1_keypair_create_cold_2();
          return;
        }
        if (seckey == (uchar *)0x0) {
          secp256k1_keypair_create_cold_1();
          return;
        }
        iVar7 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,asStack_100,&sStack_b0,seckey);
        secp256k1_scalar_get_b32((uchar *)bin,asStack_100);
        secp256k1_ge_to_bytes((uchar *)(bin + 2),&sStack_b0);
        cVar6 = ((byte)iVar7 ^ 1) - 1;
        auVar17 = ZEXT216(CONCAT11(cVar6,cVar6));
        auVar17 = pshuflw(auVar17,auVar17,0);
        uVar16 = auVar17._0_4_;
        lVar9 = 0;
        do {
          puVar1 = (uint *)(*bin + lVar9);
          uVar3 = puVar1[1];
          uVar4 = puVar1[2];
          uVar5 = puVar1[3];
          puVar2 = (uint *)(*bin + lVar9);
          *puVar2 = *puVar1 & uVar16;
          puVar2[1] = uVar3 & uVar16;
          puVar2[2] = uVar4 & uVar16;
          puVar2[3] = uVar5 & uVar16;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x60);
        return;
      }
      secp256k1_keypair_create_cold_3();
      return;
    }
    uVar14 = (ulong)bin & 0xfffffffffffff;
    uVar12 = uVar12 & 0xfffffffffffff;
    uVar11 = uVar11 & 0xfffffffffffff;
    uVar8 = uVar8 + 0x1000003d1 & 0xfffffffffffff;
    uVar15 = uVar10 & 0xffffffffffff;
  }
  r->n[0] = uVar8;
  r->n[1] = uVar11;
  r->n[2] = uVar12;
  r->n[3] = uVar14;
  r->n[4] = uVar15;
  r->magnitude = 1;
  r->normalized = 1;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize_var(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize_var(r);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}